

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_test.cpp
# Opt level: O0

void __thiscall PackedArray_speed_Test::PackedArray_speed_Test(PackedArray_speed_Test *this)

{
  PackedArray_speed_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PackedArray_speed_Test_001b9ba0;
  return;
}

Assistant:

TEST(PackedArray, speed) {
    std::random_device rd;     //Get a random seed from the OS entropy device, or whatever
    std::mt19937_64 eng(rd());
    std::uniform_int_distribution<uint32_t> distr;

    const unsigned tot = 128*1024*1024;
    const unsigned els = 2048;

    vector<uint32_t> offs;
    offs.reserve(tot);
    vector<uint32_t> val;
    val.reserve(tot);

    for (int a = 0; a < els; a++) {
        val.push_back(distr(eng));
        offs.push_back(distr(eng) & (els-1));
    }

    for (int bits = 1; bits < 32; bits++) {

        PackedArray *pa = PackedArray_create(bits, els);
        for(int i =0; i<tot; i++) {
            PackedArray_set(pa, offs[i], val[i]);
        }

        cerr << "bits="<<bits <<"speed: "<< tot / 1024 / 1024/ relClockOffset() << "MEl"<< "\n";
    }
}